

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

Pattern * __thiscall CombinePattern::doOr(CombinePattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  undefined4 extraout_var;
  DisjointPattern *a;
  DisjointPattern *b_00;
  _func_int **pp_Var2;
  OrPattern *this_00;
  DisjointPattern *pDVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*b->_vptr_Pattern[8])(b);
  if (iVar1 != 0) {
    iVar1 = (*b->_vptr_Pattern[4])(b,this,(ulong)(uint)-sa);
    return (Pattern *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = (*(this->super_DisjointPattern).super_Pattern._vptr_Pattern[2])(this);
  a = (DisjointPattern *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*b->_vptr_Pattern[2])(b);
  b_00 = (DisjointPattern *)CONCAT44(extraout_var_01,iVar1);
  if (sa < 0) {
    sa = -sa;
    pp_Var2 = (a->super_Pattern)._vptr_Pattern;
    pDVar3 = a;
  }
  else {
    pp_Var2 = (b_00->super_Pattern)._vptr_Pattern;
    pDVar3 = b_00;
  }
  (*pp_Var2[3])(pDVar3,(ulong)(uint)sa);
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern::OrPattern(this_00,a,b_00);
  return &this_00->super_Pattern;
}

Assistant:

Pattern *CombinePattern::doOr(const Pattern *b,int4 sa) const

{
  if (b->numDisjoint() != 0)
    return b->doOr(this,-sa);

  DisjointPattern *res1 = (DisjointPattern *)simplifyClone();
  DisjointPattern *res2 = (DisjointPattern *)b->simplifyClone();
  if (sa < 0)
    res1->shiftInstruction(-sa);
  else
    res2->shiftInstruction(sa);
  OrPattern *tmp = new OrPattern(res1,res2);
  return tmp;
}